

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Concat.hpp
# Opt level: O0

void __thiscall
linq::
ConcatState<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>,_linq::IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>,_light_&>
::Advance(ConcatState<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>,_linq::IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>,_light_&>
          *this)

{
  bool bVar1;
  ConcatState<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>,_linq::IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>,_light_&>
  *this_local;
  
  if ((this->s1 & 1U) == 0) {
    IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>::
    Advance(&this->source2);
  }
  else {
    AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>::Advance(&this->source1);
    bVar1 = AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>::Valid
                      (&this->source1);
    if (!bVar1) {
      this->s1 = false;
    }
  }
  return;
}

Assistant:

void Advance() override final
		{
			if(s1){
				source1.Advance();
				if(!source1.Valid())
					s1 = false;
			}
			else
				source2.Advance();
		}